

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void handleSelectionClear(XEvent *event)

{
  ulong uVar1;
  
  uVar1 = (ulong)((event->xkey).root != _glfw.x11.PRIMARY);
  free(*(void **)(_glfw.x11.keyName + uVar1 * 8 + -0x10));
  *(undefined8 *)(_glfw.x11.keyName + uVar1 * 8 + -0x10) = 0;
  return;
}

Assistant:

static void handleSelectionClear(XEvent* event)
{
    if (event->xselectionclear.selection == _glfw.x11.PRIMARY)
    {
        free(_glfw.x11.primarySelectionString);
        _glfw.x11.primarySelectionString = NULL;
    }
    else
    {
        free(_glfw.x11.clipboardString);
        _glfw.x11.clipboardString = NULL;
    }
}